

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::generateDES
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  ulong uVar1;
  _func_int *p_Var2;
  void *pvVar3;
  SoftHSM *pSVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  Session *this_00;
  CryptoFactory *pCVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar10;
  long *plVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CK_ULONG CVar12;
  CK_ULONG CVar13;
  unsigned_long *puVar14;
  CK_OBJECT_HANDLE_PTR pCVar15;
  CK_ULONG i;
  ulong uVar16;
  DESKey *pDVar17;
  bool bVar18;
  bool bVar19;
  CK_RV CStack_470;
  CK_BBOOL isOnToken_local;
  DESKey *local_460;
  CK_OBJECT_HANDLE_PTR local_458;
  long *local_450;
  SoftHSM *local_448;
  Token *local_440;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  OSAttribute local_428;
  ByteString kcv;
  ByteString value;
  CK_ATTRIBUTE keyAttribs [32];
  
  *phKey = 0;
  isOnToken_local = isOnToken;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  local_440 = Session::getToken(this_00);
  if (local_440 == (Token *)0x0) {
    return 5;
  }
  puVar14 = &pTemplate->ulValueLen;
  bVar18 = true;
  CVar12 = ulCount;
  while (bVar19 = CVar12 != 0, CVar12 = CVar12 - 1, local_448 = this, bVar19) {
    if (((_CK_ATTRIBUTE *)(puVar14 + -2))->type == 0x90) {
      if (*puVar14 != 0) {
        softHSMLog(6,"generateDES",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x1ee1,"CKA_CHECK_VALUE must be a no-value (0 length) entry");
        return 0x13;
      }
      bVar18 = false;
    }
    puVar14 = puVar14 + 3;
  }
  local_458 = phKey;
  local_460 = (DESKey *)operator_new(0x38);
  DESKey::DESKey(local_460,0x38);
  pCVar9 = CryptoFactory::i();
  iVar8 = (**pCVar9->_vptr_CryptoFactory)(pCVar9,2);
  local_450 = (long *)CONCAT44(extraout_var,iVar8);
  if (local_450 == (long *)0x0) {
    softHSMLog(3,"generateDES",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1ef0,"Could not get SymmetricAlgorithm");
    (*(local_460->super_SymmetricKey).super_Serialisable._vptr_Serialisable[2])();
    return 5;
  }
  pCVar9 = CryptoFactory::i();
  iVar8 = (*pCVar9->_vptr_CryptoFactory[8])(pCVar9,1);
  plVar11 = local_450;
  pDVar17 = local_460;
  if (CONCAT44(extraout_var_00,iVar8) == 0) {
    softHSMLog(3,"generateDES",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1ef7,"Could not get RNG");
    lVar10 = *local_450;
    plVar11 = local_450;
LAB_00139709:
    (**(code **)(lVar10 + 0x50))(plVar11,pDVar17);
    pCVar9 = CryptoFactory::i();
    (*pCVar9->_vptr_CryptoFactory[1])(pCVar9,plVar11);
    return 5;
  }
  cVar5 = (**(code **)(*local_450 + 0x58))(local_450,local_460,CONCAT44(extraout_var_00,iVar8));
  if (cVar5 == '\0') {
    softHSMLog(3,"generateDES",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1efe,"Could not generate DES secret key");
    lVar10 = *plVar11;
    pDVar17 = local_460;
    goto LAB_00139709;
  }
  objClass = 4;
  keyType = 0x13;
  memset(keyAttribs,0,0x300);
  pCVar15 = local_458;
  keyAttribs[0].pValue = &objClass;
  keyAttribs[0].ulValueLen = 8;
  keyAttribs[1].type = 1;
  keyAttribs[1].pValue = &isOnToken_local;
  keyAttribs[1].ulValueLen = 1;
  keyAttribs[2].type = 2;
  keyAttribs[2].pValue = &isPrivate;
  keyAttribs[2].ulValueLen = 1;
  keyAttribs[3].type = 0x100;
  keyAttribs[3].pValue = &keyType;
  keyAttribs[3].ulValueLen = 8;
  CVar12 = 4;
  for (uVar16 = 0; (ulCount < 0x1d && (uVar16 < ulCount)); uVar16 = uVar16 + 1) {
    uVar1 = pTemplate->type;
    CVar13 = CVar12;
    if ((2 < uVar1) && ((uVar1 != 0x90 && (uVar1 != 0x100)))) {
      CVar13 = CVar12 + 1;
      keyAttribs[CVar12].ulValueLen = pTemplate->ulValueLen;
      pvVar3 = pTemplate->pValue;
      keyAttribs[CVar12].type = pTemplate->type;
      keyAttribs[CVar12].pValue = pvVar3;
    }
    pTemplate = pTemplate + 1;
    CVar12 = CVar13;
  }
  CStack_470 = 0xd1;
  if ((0x1c < ulCount) ||
     (CStack_470 = CreateObject(local_448,hSession,keyAttribs,CVar12,local_458,4), CStack_470 != 0))
  goto LAB_00139761;
  plVar11 = (long *)HandleManager::getObject(local_448->handleManager,*pCVar15);
  CStack_470 = 6;
  if ((plVar11 == (long *)0x0) ||
     ((cVar5 = (**(code **)(*plVar11 + 0x50))(plVar11), CStack_470 = 6, cVar5 == '\0' ||
      (cVar5 = (**(code **)(*plVar11 + 0x58))(plVar11,1), cVar5 == '\0')))) goto LAB_00139761;
  OSAttribute::OSAttribute(&local_428,true);
  cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x163,&local_428);
  OSAttribute::~OSAttribute(&local_428);
  if (cVar5 == '\0') {
    cVar5 = '\0';
  }
  else {
    OSAttribute::OSAttribute(&local_428,0x120);
    cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x166,&local_428);
    OSAttribute::~OSAttribute(&local_428);
  }
  pCVar15 = local_458;
  cVar6 = '\0';
  bVar19 = (bool)(**(code **)(*plVar11 + 0x20))(plVar11,0x103,0);
  if (cVar5 != '\0') {
    OSAttribute::OSAttribute(&local_428,bVar19);
    cVar6 = (**(code **)(*plVar11 + 0x40))(plVar11,0x165,&local_428);
    OSAttribute::~OSAttribute(&local_428);
    pCVar15 = local_458;
  }
  cVar5 = '\0';
  bVar7 = (**(code **)(*plVar11 + 0x20))(plVar11,0x162,0);
  if (cVar6 != '\0') {
    OSAttribute::OSAttribute(&local_428,(bool)(bVar7 ^ 1));
    cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x164,&local_428);
    OSAttribute::~OSAttribute(&local_428);
    pCVar15 = local_458;
  }
  ByteString::ByteString(&value);
  ByteString::ByteString(&kcv);
  p_Var2 = (local_460->super_SymmetricKey).super_Serialisable._vptr_Serialisable[4];
  if (isPrivate == '\0') {
    iVar8 = (*p_Var2)();
    ByteString::operator=(&value,(ByteString *)CONCAT44(extraout_var_02,iVar8));
    (*(local_460->super_SymmetricKey).super_Serialisable._vptr_Serialisable[5])(&local_428);
    ByteString::operator=(&kcv,(ByteString *)&local_428);
  }
  else {
    iVar8 = (*p_Var2)();
    Token::encrypt(local_440,(char *)CONCAT44(extraout_var_01,iVar8),(int)&value);
    (*(local_460->super_SymmetricKey).super_Serialisable._vptr_Serialisable[5])(&local_428);
    Token::encrypt(local_440,(char *)&local_428,(int)&kcv);
  }
  ByteString::~ByteString((ByteString *)&local_428);
  if (cVar5 == '\0') {
LAB_00139a45:
    (**(code **)(*plVar11 + 0x68))(plVar11);
    cVar5 = '\0';
  }
  else {
    OSAttribute::OSAttribute(&local_428,&value);
    cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x11,&local_428);
    OSAttribute::~OSAttribute(&local_428);
    if (bVar18) {
      if (cVar5 == '\0') goto LAB_00139a45;
      OSAttribute::OSAttribute(&local_428,&kcv);
      cVar5 = (**(code **)(*plVar11 + 0x40))(plVar11,0x90,&local_428);
      OSAttribute::~OSAttribute(&local_428);
    }
    if (cVar5 == '\0') goto LAB_00139a45;
    cVar5 = (**(code **)(*plVar11 + 0x60))(plVar11);
  }
  ByteString::~ByteString(&kcv);
  ByteString::~ByteString(&value);
  CStack_470 = 6;
  if (cVar5 != '\0') {
    CStack_470 = 0;
  }
LAB_00139761:
  plVar11 = local_450;
  (**(code **)(*local_450 + 0x50))(local_450,local_460);
  pCVar9 = CryptoFactory::i();
  (*pCVar9->_vptr_CryptoFactory[1])(pCVar9,plVar11);
  pSVar4 = local_448;
  if (CStack_470 == 0) {
    return 0;
  }
  if (*pCVar15 == 0) {
    return CStack_470;
  }
  plVar11 = (long *)HandleManager::getObject(local_448->handleManager,*pCVar15);
  HandleManager::destroyObject(pSVar4->handleManager,*pCVar15);
  if (plVar11 != (long *)0x0) {
    (**(code **)(*plVar11 + 0x70))(plVar11);
  }
  *pCVar15 = 0;
  return CStack_470;
}

Assistant:

CK_RV SoftHSM::generateDES
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Generate the secret key
	DESKey* key = new DESKey(56);
	SymmetricAlgorithm* des = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::DES);
	if (des == NULL)
	{
		ERROR_MSG("Could not get SymmetricAlgorithm");
		delete key;
		return CKR_GENERAL_ERROR;
	}
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL)
	{
		ERROR_MSG("Could not get RNG");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}
	if (!des->generateKey(*key, rng))
	{
		ERROR_MSG("Could not generate DES secret key");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}

	CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_DES;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			keyAttribs[keyAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, keyAttribs, keyAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DES_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// DES Secret Key Attributes
			ByteString value;
			ByteString kcv;
			if (isPrivate)
			{
				token->encrypt(key->getKeyBits(), value);
				token->encrypt(key->getKeyCheckValue(), kcv);
			}
			else
			{
				value = key->getKeyBits();
				kcv = key->getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	des->recycleKey(key);
	CryptoFactory::i()->recycleSymmetricAlgorithm(des);

	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}